

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O2

bool __thiscall Snake::SnakeCell(Snake *this,int x,int y)

{
  pointer pSVar1;
  bool bVar2;
  pointer pSVar3;
  bool bVar4;
  
  if (((int)this->head_x != x) || (bVar2 = true, (int)this->head_y != y)) {
    pSVar1 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pSVar3 = pSVar1;
      bVar4 = pSVar3 == (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
      bVar2 = !bVar4;
      if (bVar4) {
        return bVar2;
      }
      pSVar1 = pSVar3 + 1;
    } while ((pSVar3->x != x) || (pSVar3->y != y));
  }
  return bVar2;
}

Assistant:

bool Snake::SnakeCell(int x, int y) {
    if (x == static_cast<int>(head_x) && y == static_cast<int>(head_y)) {
        return true;
    }
    for (auto const &item : body) {
        if (x == item.x && y == item.y) {
            return true;
        }
    }
    return false;
}